

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeStore
          (ScalarReplacementPass *this,Instruction *store,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<spvtools::opt::Operand> __l_00;
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  uint32_t ty_id;
  uint32_t uVar5;
  IRContext *pIVar6;
  reference ppIVar7;
  Instruction *pIVar8;
  Instruction *this_00;
  DefUseManager *pDVar9;
  Operand *pOVar10;
  pointer this_01;
  Instruction *pIVar11;
  Operand *local_328;
  Operand *local_2f0;
  iterator local_2e0;
  undefined1 local_2d8 [8];
  Operand copy;
  allocator<spvtools::opt::Operand> local_29d;
  uint32_t i;
  iterator local_298;
  undefined8 local_290;
  SmallVector<unsigned_int,_2UL> local_288;
  uint32_t local_25c;
  iterator local_258;
  undefined8 local_250;
  SmallVector<unsigned_int,_2UL> local_248;
  Operand local_220;
  Operand OStack_1f0;
  iterator local_1c0;
  _func_int **local_1b8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_1b0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_198
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> newStore;
  iterator iter;
  SmallVector<unsigned_int,_2UL> local_170;
  uint32_t local_144;
  iterator local_140;
  undefined8 local_138;
  SmallVector<unsigned_int,_2UL> local_130;
  Operand local_108;
  Operand OStack_d8;
  iterator local_a8;
  _func_int **local_a0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_98;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_80;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> extract;
  uint32_t extractId;
  Instruction *type;
  Instruction *var;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  uint32_t elementIndex;
  iterator where;
  BasicBlock *block;
  uint32_t storeInput;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *replacements_local;
  Instruction *store_local;
  ScalarReplacementPass *this_local;
  
  uVar3 = Instruction::GetSingleWordInOperand(store,1);
  pIVar6 = Pass::context((Pass *)this);
  where.super_iterator.node_ = (iterator)IRContext::get_instr_block(pIVar6,store);
  InstructionList::iterator::iterator((iterator *)&stack0xffffffffffffffc0,store);
  __range2._4_4_ = 0;
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin(replacements);
  var = (Instruction *)
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        end(replacements);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                *)&var);
    if (!bVar2) {
      return true;
    }
    ppIVar7 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    pIVar11 = *ppIVar7;
    OVar4 = Instruction::opcode(pIVar11);
    if (OVar4 == OpVariable) {
      pIVar8 = GetStorageType(this,pIVar11);
      extract._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
           Pass::TakeNextId((Pass *)this);
      if (extract._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ == 0) {
        return false;
      }
      this_00 = (Instruction *)operator_new(0x70);
      pIVar6 = Pass::context((Pass *)this);
      ty_id = Instruction::result_id(pIVar8);
      uVar5 = extract._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
      local_140 = &local_144;
      local_138 = 1;
      init_list_02._M_len = 1;
      init_list_02._M_array = local_140;
      local_144 = uVar3;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_130,init_list_02);
      Operand::Operand(&local_108,SPV_OPERAND_TYPE_ID,&local_130);
      iter.super_iterator.node_._4_4_ = __range2._4_4_;
      init_list_01._M_len = 1;
      init_list_01._M_array = (iterator)((long)&iter.super_iterator.node_ + 4);
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_170,init_list_01);
      Operand::Operand(&OStack_d8,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_170);
      local_a8 = &local_108;
      local_a0 = (_func_int **)0x2;
      std::allocator<spvtools::opt::Operand>::allocator
                ((allocator<spvtools::opt::Operand> *)((long)&iter.super_iterator.node_ + 3));
      __l_00._M_len = (size_type)local_a0;
      __l_00._M_array = local_a8;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_98,__l_00,(allocator_type *)((long)&iter.super_iterator.node_ + 3));
      Instruction::Instruction(this_00,pIVar6,OpCompositeExtract,ty_id,uVar5,&local_98);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_80,this_00);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_98);
      std::allocator<spvtools::opt::Operand>::~allocator
                ((allocator<spvtools::opt::Operand> *)((long)&iter.super_iterator.node_ + 3));
      local_2f0 = (Operand *)&local_a8;
      do {
        local_2f0 = local_2f0 + -1;
        Operand::~Operand(local_2f0);
      } while (local_2f0 != &local_108);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_170);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_130);
      InstructionList::iterator::InsertBefore
                ((iterator *)&newStore,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&stack0xffffffffffffffc0);
      pIVar8 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)&newStore);
      Instruction::UpdateDebugInfoFrom(pIVar8,store);
      pDVar9 = Pass::get_def_use_mgr((Pass *)this);
      pIVar8 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)&newStore);
      analysis::DefUseManager::AnalyzeInstDefUse(pDVar9,pIVar8);
      pIVar6 = Pass::context((Pass *)this);
      pIVar8 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)&newStore);
      IRContext::set_instr_block(pIVar6,pIVar8,(BasicBlock *)where.super_iterator.node_);
      pIVar8 = (Instruction *)operator_new(0x70);
      pIVar6 = Pass::context((Pass *)this);
      local_25c = Instruction::result_id(pIVar11);
      local_258 = &local_25c;
      local_250 = 1;
      init_list_00._M_len = 1;
      init_list_00._M_array = local_258;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_248,init_list_00);
      Operand::Operand(&local_220,SPV_OPERAND_TYPE_ID,&local_248);
      i = extract._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
      local_298 = &i;
      local_290 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_298;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_288,init_list);
      Operand::Operand(&OStack_1f0,SPV_OPERAND_TYPE_ID,&local_288);
      local_1c0 = &local_220;
      local_1b8 = (_func_int **)0x2;
      std::allocator<spvtools::opt::Operand>::allocator(&local_29d);
      __l._M_len = (size_type)local_1b8;
      __l._M_array = local_1c0;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_1b0,__l,&local_29d);
      Instruction::Instruction(pIVar8,pIVar6,OpStore,0,0,&local_1b0);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_198,pIVar8);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_1b0);
      std::allocator<spvtools::opt::Operand>::~allocator(&local_29d);
      local_328 = (Operand *)&local_1c0;
      do {
        local_328 = local_328 + -1;
        Operand::~Operand(local_328);
      } while (local_328 != &local_220);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_288);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_248);
      for (copy.words.large_data_._M_t.
           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
           ._M_head_impl._4_4_ = 2;
          uVar1 = copy.words.large_data_._M_t.
                  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                  ._M_head_impl._4_4_, uVar5 = Instruction::NumInOperands(store), uVar1 < uVar5;
          copy.words.large_data_._M_t.
          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl._4_4_ =
               copy.words.large_data_._M_t.
               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl._4_4_ + 1) {
        pOVar10 = Instruction::GetInOperand
                            (store,copy.words.large_data_._M_t.
                                   super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                   ._M_head_impl._4_4_);
        Operand::Operand((Operand *)local_2d8,pOVar10);
        this_01 = std::
                  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ::operator->(&local_198);
        Instruction::AddOperand(this_01,(Operand *)local_2d8);
        Operand::~Operand((Operand *)local_2d8);
      }
      InstructionList::iterator::InsertBefore
                (&local_2e0,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&stack0xffffffffffffffc0);
      InstructionList::iterator::operator=((iterator *)&newStore,&local_2e0);
      pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator->
                          ((iterator_template<spvtools::opt::Instruction> *)&newStore);
      Instruction::UpdateDebugInfoFrom(pIVar11,store);
      pDVar9 = Pass::get_def_use_mgr((Pass *)this);
      pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator*
                          ((iterator_template<spvtools::opt::Instruction> *)&newStore);
      analysis::DefUseManager::AnalyzeInstDefUse(pDVar9,pIVar11);
      pIVar6 = Pass::context((Pass *)this);
      pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator*
                          ((iterator_template<spvtools::opt::Instruction> *)&newStore);
      IRContext::set_instr_block(pIVar6,pIVar11,(BasicBlock *)where.super_iterator.node_);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_198);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_80);
    }
    __range2._4_4_ = __range2._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeStore(
    Instruction* store, const std::vector<Instruction*>& replacements) {
  // Replaces a store to the whole composite with a series of extract and stores
  // to each element.
  uint32_t storeInput = store->GetSingleWordInOperand(1u);
  BasicBlock* block = context()->get_instr_block(store);
  BasicBlock::iterator where(store);
  uint32_t elementIndex = 0;
  for (auto var : replacements) {
    // Create the extract.
    if (var->opcode() != spv::Op::OpVariable) {
      elementIndex++;
      continue;
    }

    Instruction* type = GetStorageType(var);
    uint32_t extractId = TakeNextId();
    if (extractId == 0) {
      return false;
    }
    std::unique_ptr<Instruction> extract(new Instruction(
        context(), spv::Op::OpCompositeExtract, type->result_id(), extractId,
        std::initializer_list<Operand>{
            {SPV_OPERAND_TYPE_ID, {storeInput}},
            {SPV_OPERAND_TYPE_LITERAL_INTEGER, {elementIndex++}}}));
    auto iter = where.InsertBefore(std::move(extract));
    iter->UpdateDebugInfoFrom(store);
    get_def_use_mgr()->AnalyzeInstDefUse(&*iter);
    context()->set_instr_block(&*iter, block);

    // Create the store.
    std::unique_ptr<Instruction> newStore(
        new Instruction(context(), spv::Op::OpStore, 0, 0,
                        std::initializer_list<Operand>{
                            {SPV_OPERAND_TYPE_ID, {var->result_id()}},
                            {SPV_OPERAND_TYPE_ID, {extractId}}}));
    // Copy memory access attributes which start at index 2. Index 0 is the
    // pointer and index 1 is the data.
    for (uint32_t i = 2; i < store->NumInOperands(); ++i) {
      Operand copy(store->GetInOperand(i));
      newStore->AddOperand(std::move(copy));
    }
    iter = where.InsertBefore(std::move(newStore));
    iter->UpdateDebugInfoFrom(store);
    get_def_use_mgr()->AnalyzeInstDefUse(&*iter);
    context()->set_instr_block(&*iter, block);
  }
  return true;
}